

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int addk(FuncState *fs,TValue *key,TValue *v)

{
  Value *pVVar1;
  Proto *o;
  lua_State *L;
  Value VVar2;
  int iVar3;
  TValue *pTVar4;
  int *piVar5;
  TValue *io;
  long lVar6;
  int iVar7;
  
  o = fs->f;
  L = fs->ls->L;
  pTVar4 = luaH_set(L,fs->ls->h,key);
  if ((pTVar4->tt_ == 0x13) && (iVar7 = (pTVar4->value_).b, iVar7 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar7].tt_) & 0x3fU) == 0) &&
       (iVar3 = luaV_equalobj((lua_State *)0x0,o->k + iVar7,v), iVar3 != 0)) {
      return iVar7;
    }
  }
  lVar6 = (long)o->sizek;
  iVar7 = fs->nk;
  (pTVar4->value_).i = (long)iVar7;
  pTVar4->tt_ = 0x13;
  iVar3 = o->sizek;
  if (iVar3 <= iVar7) {
    pTVar4 = (TValue *)luaM_growaux_(L,o->k,&o->sizek,0x10,0x3ffffff,"constants");
    o->k = pTVar4;
    iVar3 = o->sizek;
  }
  pTVar4 = o->k;
  piVar5 = &pTVar4[lVar6].tt_;
  for (; lVar6 < iVar3; lVar6 = lVar6 + 1) {
    *piVar5 = 0;
    piVar5 = piVar5 + 4;
  }
  VVar2 = *(Value *)&v->tt_;
  pVVar1 = &pTVar4[iVar7].value_;
  *pVVar1 = v->value_;
  pVVar1[1] = VVar2;
  fs->nk = fs->nk + 1;
  if ((((v->tt_ & 0x40) != 0) && ((o->marked & 4) != 0)) && ((((v->value_).gc)->marked & 3) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
  }
  return iVar7;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttype(&f->k[k]) == ttype(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}